

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O0

void __thiscall ItemWrapper::setItemName(ItemWrapper *this,string *item)

{
  undefined1 local_38 [40];
  string *item_local;
  ItemWrapper *this_local;
  
  local_38._32_8_ = item;
  item_local = (string *)this;
  Item::getName_abi_cxx11_((Item *)local_38);
  std::__cxx11::string::operator=((string *)&this->itemName,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ItemWrapper::setItemName(std::string item) {
    itemName = classItem.getName();
}